

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O3

void sigchld_handler(int signum,siginfo_t *handler_info,void *handler_context)

{
  int *piVar1;
  int iVar2;
  __id_t _Var3;
  int iVar4;
  int *piVar5;
  ProcessInfo *pPVar6;
  SmallArray *header;
  long lVar7;
  BigArray *header_00;
  long in_FS_OFFSET;
  bool bVar8;
  pipe_payload local_150;
  siginfo_t local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((__sighandler_t)0x1 < old_sigaction.__sigaction_handler.sa_handler) {
    if (((byte)old_sigaction.sa_flags & 4) == 0) {
      (*old_sigaction.__sigaction_handler.sa_handler)(signum);
    }
    else {
      (*old_sigaction.__sigaction_handler.sa_handler)(signum);
    }
  }
  if (forkfd_status == 1) {
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    local_b8.si_signo = 0;
    local_b8.si_errno = 0;
    local_b8.si_code = 0;
    local_b8._12_4_ = 0;
    local_b8._sifields._pad[0] = 0;
    local_b8._sifields._pad[1] = 0;
    local_b8._sifields._timer.si_sigval.sival_ptr = (sigval_t)0x0;
    local_b8._sifields._sigchld.si_utime = 0;
    local_b8._sifields._sigchld.si_stime = 0;
    local_b8._sifields._32_8_ = 0;
    local_b8._sifields._40_8_ = 0;
    local_b8._sifields._48_8_ = 0;
    local_b8._sifields._56_8_ = 0;
    local_b8._sifields._64_8_ = 0;
    local_b8._sifields._72_8_ = 0;
    local_b8._sifields._80_8_ = 0;
    local_b8._sifields._88_8_ = 0;
    local_b8._sifields._96_8_ = 0;
    local_b8._sifields._104_8_ = 0;
    memset(&local_150,0,0x98);
    waitid(P_ALL,0,&local_b8,0x1000005);
    if (local_b8._sifields._pad[0] != 0) {
      lVar7 = 0;
LAB_0043acaf:
      do {
        LOCK();
        bVar8 = local_b8._sifields._pad[0] == children.entries[lVar7].pid;
        if (bVar8) {
          children.entries[lVar7].pid = -1;
        }
        UNLOCK();
        if (bVar8) goto code_r0x0043acc1;
        lVar7 = lVar7 + 1;
        header = (SmallArray *)children.header.nextArray;
      } while (lVar7 != 0x10);
      for (; (BigArray *)header != (BigArray *)0x0;
          header = (SmallArray *)(((BigArray *)header)->header).nextArray) {
        lVar7 = 0x10;
        do {
          piVar1 = (int *)((long)&(((BigArray *)(((BigArray *)header)->entries + -2))->header).
                                  nextArray + lVar7);
          LOCK();
          bVar8 = local_b8._sifields._pad[0] == *piVar1;
          if (bVar8) {
            *piVar1 = -1;
          }
          UNLOCK();
          if (bVar8) {
            iVar4 = tryReaping(local_b8._sifields._pad[0],&local_150);
            if (iVar4 == 0) goto LAB_0043ad36;
            pPVar6 = (ProcessInfo *)
                     ((long)&(((BigArray *)(((BigArray *)header)->entries + -2))->header).nextArray
                     + lVar7);
            goto LAB_0043ad2e;
          }
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x810);
      }
      lVar7 = 0;
      do {
        _Var3 = *(__id_t *)((long)&children.entries[0].pid + lVar7);
        if (0 < (int)_Var3) {
          local_b8._sifields._sigpoll.si_band =
               local_b8._sifields._sigpoll.si_band & 0xffffffff00000000;
          iVar4 = waitid(P_PID,_Var3,&local_b8,0x1000005);
          if ((iVar4 == 0) && (local_b8._sifields._pad[0] == _Var3)) {
            pPVar6 = (ProcessInfo *)((long)&children.entries[0].pid + lVar7);
            LOCK();
            bVar8 = _Var3 == pPVar6->pid;
            if (bVar8) {
              pPVar6->pid = -1;
            }
            UNLOCK();
            if ((bVar8) && (iVar4 = tryReaping(_Var3,&local_150), iVar4 != 0)) {
              notifyAndFreeInfo(&children.header,pPVar6,&local_150);
            }
          }
        }
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x80);
      if (children.header.nextArray != (BigArray *)0x0) {
        header_00 = children.header.nextArray;
        do {
          lVar7 = 0x10;
          do {
            _Var3 = *(__id_t *)
                     ((long)&(((BigArray *)(header_00->entries + -2))->header).nextArray + lVar7);
            if (0 < (int)_Var3) {
              local_b8._sifields._sigpoll.si_band =
                   local_b8._sifields._sigpoll.si_band & 0xffffffff00000000;
              iVar4 = waitid(P_PID,_Var3,&local_b8,0x1000005);
              if ((iVar4 == 0) && (local_b8._sifields._pad[0] == _Var3)) {
                pPVar6 = (ProcessInfo *)
                         ((long)&(((BigArray *)(header_00->entries + -2))->header).nextArray + lVar7
                         );
                LOCK();
                bVar8 = _Var3 == pPVar6->pid;
                if (bVar8) {
                  pPVar6->pid = -1;
                }
                UNLOCK();
                if ((bVar8) && (iVar4 = tryReaping(_Var3,&local_150), iVar4 != 0)) {
                  notifyAndFreeInfo(&header_00->header,pPVar6,&local_150);
                }
              }
            }
            lVar7 = lVar7 + 8;
          } while (lVar7 != 0x810);
          header_00 = (header_00->header).nextArray;
        } while (header_00 != (BigArray *)0x0);
      }
    }
LAB_0043ae89:
    *piVar5 = iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
code_r0x0043acc1:
  iVar4 = tryReaping(local_b8._sifields._pad[0],&local_150);
  if (iVar4 != 0) {
    pPVar6 = children.entries + lVar7;
    header = &children;
LAB_0043ad2e:
    notifyAndFreeInfo(&header->header,pPVar6,&local_150);
  }
LAB_0043ad36:
  local_b8._sifields._sigpoll.si_band = local_b8._sifields._sigpoll.si_band & 0xffffffff00000000;
  waitid(P_ALL,0,&local_b8,0x1000005);
  lVar7 = 0;
  if (local_b8._sifields._pad[0] == 0) goto LAB_0043ae89;
  goto LAB_0043acaf;
}

Assistant:

static void sigchld_handler(int signum, siginfo_t *handler_info, void *handler_context)
{
    /*
     * This is a signal handler, so we need to be careful about which functions
     * we can call. See the full, official listing in the POSIX.1-2008
     * specification at:
     *   http://pubs.opengroup.org/onlinepubs/9699919799/functions/V2_chap02.html#tag_15_04_03
     *
     * The handler_info and handler_context parameters may not be valid, if
     * we're a chained handler from another handler that did not use
     * SA_SIGINFO. Therefore, we must obtain the siginfo ourselves directly by
     * calling waitid.
     *
     * But we pass them anyway. Let's call the chained handler first, while
     * those two arguments have a chance of being correct.
     */
    if (old_sigaction.sa_handler != SIG_IGN && old_sigaction.sa_handler != SIG_DFL) {
        if (old_sigaction.sa_flags & SA_SIGINFO)
            old_sigaction.sa_sigaction(signum, handler_info, handler_context);
        else
            old_sigaction.sa_handler(signum);
    }

    if (ffd_atomic_load(&forkfd_status, FFD_ATOMIC_RELAXED) == 1) {
        int saved_errno = errno;
        reapChildProcesses();
        errno = saved_errno;
    }
}